

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::Exception::Context> * __thiscall
kj::Own<kj::Exception::Context>::operator=
          (Own<kj::Exception::Context> *this,Own<kj::Exception::Context> *other)

{
  Disposer *this_00;
  Context *object;
  Context *ptrCopy;
  Disposer *disposerCopy;
  Own<kj::Exception::Context> *other_local;
  Own<kj::Exception::Context> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (Context *)0x0;
  if (object != (Context *)0x0) {
    Disposer::dispose<kj::Exception::Context>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }